

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

int cpu_exec_ppc64(uc_struct_conflict11 *uc,CPUState *cpu)

{
  _Bool _Var1;
  int iVar2;
  TranslationBlock *pTVar3;
  TranslationBlock *tb;
  uint32_t cflags;
  int tb_exit;
  TranslationBlock *last_tb;
  CPUClass *pCStack_28;
  int ret;
  CPUClass *cc;
  CPUState *cpu_local;
  uc_struct_conflict11 *uc_local;
  
  pCStack_28 = cpu->cc;
  cc = (CPUClass *)cpu;
  cpu_local = (CPUState *)uc;
  _Var1 = cpu_handle_halt(cpu);
  if (_Var1) {
    uc_local._4_4_ = 0x10003;
  }
  else {
    (*pCStack_28->cpu_exec_enter)((CPUState_conflict *)cc);
    iVar2 = __sigsetjmp(cpu_local->tb_jmp_cache +
                        (long)(*(int *)(cpu_local->tb_jmp_cache + 0x715) + -1) * 0x19 + 0xd5,0);
    if (iVar2 != 0) {
      pCStack_28 = (CPUClass *)cc[0xc5].asidx_from_attrs;
      assert_no_pages_locked();
    }
    while (_Var1 = cpu_handle_exception((CPUState *)cc,(int *)((long)&last_tb + 4)),
          ((_Var1 ^ 0xffU) & 1) != 0) {
      _cflags = (TranslationBlock *)0x0;
      tb._4_4_ = 0;
      while (_Var1 = cpu_handle_interrupt((CPUState *)cc,(TranslationBlock **)&cflags),
            ((_Var1 ^ 0xffU) & 1) != 0) {
        tb._0_4_ = *(uint32_t *)&cc->do_unaligned_access;
        if ((uint32_t)tb == 0xffffffff) {
          tb._0_4_ = curr_cflags();
        }
        else {
          *(undefined4 *)&cc->do_unaligned_access = 0xffffffff;
        }
        pTVar3 = tb_find((CPUState *)cc,_cflags,tb._4_4_,(uint32_t)tb);
        if (((ulong)cc->do_interrupt & 0x10000000000) == 0) {
          cpu_loop_exec_tb((CPUState *)cc,pTVar3,(TranslationBlock **)&cflags,(int *)((long)&tb + 4)
                          );
        }
      }
    }
    pTVar3 = cpu_local->tb_jmp_cache[0xd];
    pTVar3[0xcf].jmp_reset_offset[0] = 0;
    pTVar3[0xcf].jmp_reset_offset[1] = 0;
    (*pCStack_28->cpu_exec_exit)((CPUState_conflict *)cc);
    uc_local._4_4_ = last_tb._4_4_;
  }
  return uc_local._4_4_;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}